

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.cpp
# Opt level: O0

void pzgeom::TPZGeoPyramid::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  long *nelem;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  uint in_ESI;
  TPZGeoMesh *in_RDI;
  int64_t index;
  int j;
  int i_1;
  int i;
  TPZManVector<long,_5> nodeindexes;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZManVector<double,_3> co;
  TPZGeoMesh *in_stack_fffffffffffffe20;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffe28;
  TPZGeoNode *in_stack_fffffffffffffe30;
  int64_t in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined1 local_138 [12];
  int local_12c;
  int local_128;
  int local_124;
  TPZVec<long> local_120 [2];
  TPZVec<double> local_d8 [2];
  TPZVec<double> local_90;
  TPZVec<double> local_58;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  uint local_c;
  TPZGeoMesh *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  TPZManVector<long,_5>::TPZManVector
            ((TPZManVector<long,_5> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             in_stack_fffffffffffffe38);
  for (local_124 = 0; local_124 < 3; local_124 = local_124 + 1) {
    pdVar5 = TPZVec<double>::operator[](local_20,(long)local_124);
    dVar1 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](local_d8,(long)local_124);
    *pdVar5 = dVar1 / 3.0;
    pdVar5 = TPZVec<double>::operator[](local_18,(long)local_124);
    dVar1 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](&local_90,(long)local_124);
    *pdVar5 = dVar1 + 0.5;
  }
  for (local_128 = 0; local_128 < 5; local_128 = local_128 + 1) {
    pztopology::TPZPyramid::ParametricDomainNodeCoord
              ((int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
               (TPZVec<double> *)in_stack_fffffffffffffe28);
    for (local_12c = 0; local_12c < 3; local_12c = local_12c + 1) {
      pdVar5 = TPZVec<double>::operator[](&local_90,(long)local_12c);
      dVar1 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[](local_d8,(long)local_12c);
      dVar2 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[](&local_58,(long)local_12c);
      dVar3 = *pdVar5;
      iVar4 = rand();
      pdVar5 = TPZVec<double>::operator[](&local_58,(long)local_12c);
      *pdVar5 = dVar2 * dVar3 + dVar1 + ((double)iVar4 * 0.2) / 2147483647.0 + -0.1;
    }
    TPZGeoMesh::NodeVec(local_8);
    iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe30 = (TPZGeoNode *)(long)iVar4;
    nelem = TPZVec<long>::operator[](local_120,(long)local_128);
    *nelem = (long)in_stack_fffffffffffffe30;
    in_stack_fffffffffffffe28 = TPZGeoMesh::NodeVec(local_8);
    in_stack_fffffffffffffe20 = (TPZGeoMesh *)TPZVec<long>::operator[](local_120,(long)local_128);
    TPZChunkVector<TPZGeoNode,_10>::operator[]
              ((TPZChunkVector<TPZGeoNode,_10> *)CONCAT44(iVar4,in_stack_fffffffffffffe40),
               (int64_t)nelem);
    TPZGeoNode::Initialize
              (in_stack_fffffffffffffe30,(TPZVec<double> *)in_stack_fffffffffffffe28,
               in_stack_fffffffffffffe20);
  }
  (*(local_8->super_TPZSavable)._vptr_TPZSavable[0xc])
            (local_8,5,local_120,(ulong)local_c,local_138,1);
  TPZManVector<long,_5>::~TPZManVector((TPZManVector<long,_5> *)in_stack_fffffffffffffe20);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffe20);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffe20);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffe20);
  return;
}

Assistant:

void
    TPZGeoPyramid::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size) {
        TPZManVector<REAL, 3> co(3), shift(3), scale(3);
        TPZManVector<int64_t, 5> nodeindexes(5);
        for (int i = 0; i < 3; i++) {
            scale[i] = size[i] / 3.;
            shift[i] = 1. / 2. + lowercorner[i];
        }

        for (int i = 0; i < NCornerNodes; i++) {
            ParametricDomainNodeCoord(i, co);
            for (int j = 0; j < 3; j++) {
                co[j] = shift[j] + scale[j] * co[j] + (rand() * 0.2 / RAND_MAX) - 0.1;
            }
            nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
            gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
        }
        int64_t index;
        gmesh.CreateGeoElement(EPiramide, nodeindexes, matid, index);
    }